

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

void OnExit(void *data)

{
  PaAlsaStream *stream;
  void *data_local;
  
  if (data != (void *)0x0) {
    PaUtil_ResetCpuLoadMeasurer((PaUtilCpuLoadMeasurer *)((long)data + 0x50));
    *(undefined4 *)((long)data + 0x23c) = 1;
    AlsaStop((PaAlsaStream *)data,*(int *)((long)data + 0x240));
    if (*(long *)((long)data + 0x20) != 0) {
      (**(code **)((long)data + 0x20))(*(undefined8 *)((long)data + 0x28));
    }
    *(undefined4 *)((long)data + 0x244) = 0;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                ,0xd7a,"void OnExit(void *)");
}

Assistant:

static void OnExit( void *data )
{
    PaAlsaStream *stream = (PaAlsaStream *) data;

    assert( data );

    PaUtil_ResetCpuLoadMeasurer( &stream->cpuLoadMeasurer );

    stream->callback_finished = 1;  /* Let the outside world know stream was stopped in callback */
    PA_DEBUG(( "%s: Stopping ALSA handles\n", __FUNCTION__ ));
    AlsaStop( stream, stream->callbackAbort );

    PA_DEBUG(( "%s: Stoppage\n", __FUNCTION__ ));

    /* Eventually notify user all buffers have played */
    if( stream->streamRepresentation.streamFinishedCallback )
    {
        stream->streamRepresentation.streamFinishedCallback( stream->streamRepresentation.userData );
    }
    stream->isActive = 0;
}